

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FACopyDescriptor.H
# Opt level: O2

FabArrayId __thiscall
amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::RegisterFabArray
          (FabArrayCopyDescriptor<amrex::FArrayBox> *this,FabArray<amrex::FArrayBox> *fabarray)

{
  pointer ppFVar1;
  pointer ppFVar2;
  FabArray<amrex::FArrayBox> *local_50;
  _Rb_tree<int,_std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>,_std::_Select1st<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>
  local_48;
  
  ppFVar1 = (this->fabArrays).
            super__Vector_base<amrex::FabArray<amrex::FArrayBox>_*,_std::allocator<amrex::FabArray<amrex::FArrayBox>_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppFVar2 = (this->fabArrays).
            super__Vector_base<amrex::FabArray<amrex::FArrayBox>_*,_std::allocator<amrex::FabArray<amrex::FArrayBox>_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = fabarray;
  std::
  vector<amrex::FabArray<amrex::FArrayBox>_*,_std::allocator<amrex::FabArray<amrex::FArrayBox>_*>_>
  ::push_back(&this->fabArrays,&local_50);
  local_48._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_48._M_impl.super__Rb_tree_header._M_header;
  local_48._M_impl._0_8_ = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_48._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_48._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_48._M_impl.super__Rb_tree_header._M_header._M_right =
       local_48._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<std::multimap<int,amrex::FabCopyDescriptor<amrex::FArrayBox>*,std::less<int>,std::allocator<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>>,std::allocator<std::multimap<int,amrex::FabCopyDescriptor<amrex::FArrayBox>*,std::less<int>,std::allocator<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>>>>
  ::
  emplace_back<std::multimap<int,amrex::FabCopyDescriptor<amrex::FArrayBox>*,std::less<int>,std::allocator<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>>>
            ((vector<std::multimap<int,amrex::FabCopyDescriptor<amrex::FArrayBox>*,std::less<int>,std::allocator<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>>,std::allocator<std::multimap<int,amrex::FabCopyDescriptor<amrex::FArrayBox>*,std::less<int>,std::allocator<std::pair<int_const,amrex::FabCopyDescriptor<amrex::FArrayBox>*>>>>>
              *)&this->fabCopyDescList,
             (multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>
              *)&local_48);
  std::
  _Rb_tree<int,_std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>,_std::_Select1st<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>
  ::~_Rb_tree(&local_48);
  return (FabArrayId)(int)((ulong)((long)ppFVar2 - (long)ppFVar1) >> 3);
}

Assistant:

FabArrayId
FabArrayCopyDescriptor<FAB>::RegisterFabArray(FabArray<FAB>* fabarray)
{
    BL_ASSERT(fabArrays.size() == fabCopyDescList.size());

    FabArrayId result(fabArrays.size());

    fabArrays.push_back(fabarray);  /* Bump size() by one */

    fabCopyDescList.push_back(FCDMap());

    return result;
}